

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

mcu8str * mcu8str_create(mcu8str *__return_storage_ptr__,mcu8str_size_t prealloc_size)

{
  int iVar1;
  char *pcVar2;
  mcu8str *pmVar3;
  uint uVar4;
  undefined8 *puVar5;
  mcu8str *str;
  uint uVar6;
  uint uVar7;
  
  if (prealloc_size == 0) {
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->size = 0;
    uVar6 = 0;
    iVar1 = 0;
LAB_00107f13:
    __return_storage_ptr__->buflen = uVar6;
    __return_storage_ptr__->owns_memory = iVar1;
    return __return_storage_ptr__;
  }
  puVar5 = (undefined8 *)prealloc_size;
  if (prealloc_size >> 1 < 0x7fffffff) {
    str = (mcu8str *)(prealloc_size + 1);
    pcVar2 = (char *)malloc((size_t)str);
    __return_storage_ptr__->c_str = pcVar2;
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
      __return_storage_ptr__->size = 0;
      uVar6 = (int)prealloc_size + 1;
      iVar1 = 1;
      goto LAB_00107f13;
    }
  }
  else {
    __return_storage_ptr__->c_str = (char *)0x0;
    str = __return_storage_ptr__;
  }
  mcu8str_create_cold_1();
  uVar6 = *(uint *)(puVar5 + 1);
  pmVar3 = (mcu8str *)(ulong)uVar6;
  if (uVar6 != 0) {
    uVar4 = str->size;
    uVar7 = uVar4 + uVar6;
    if (str->buflen <= uVar7) {
      mcu8str_reserve(str,(ulong)uVar7);
      uVar4 = str->size;
      uVar6 = *(uint *)(puVar5 + 1);
    }
    memcpy(str->c_str + uVar4,(void *)*puVar5,(ulong)uVar6);
    pmVar3 = (mcu8str *)str->c_str;
    *(undefined1 *)((long)&pmVar3->c_str + (ulong)uVar7) = 0;
    str->size = uVar7;
  }
  return pmVar3;
}

Assistant:

mcu8str mcu8str_create( mcu8str_size_t prealloc_size )
  {
    MCTOOLS_STATIC_ASSERT( sizeof(int)==sizeof(unsigned) );
    MCTOOLS_STATIC_ASSERT( sizeof(size_t)>=sizeof(unsigned) );
    MCTOOLS_STATIC_ASSERT( sizeof(unsigned)>=4 );
    MCTOOLS_STATIC_ASSERT( sizeof(size_t)>=4 );
    MCTOOLS_STATIC_ASSERT( sizeof(void*)>=4 );

    if ( prealloc_size == 0 )
      return mcu8str_create_empty();
    mcu8str s;
    //Limit prealloc_size, since we use unsigned type to store the size in
    //buflen below:
    s.c_str = (char*) ( MCTOOLS_STROKFORUINT(prealloc_size)
                        ? STDNS malloc( prealloc_size+1 ) : NULL);
    if ( !s.c_str ) {
#ifdef MCFILEUTILS_CPPNAMESPACE
      throw std::bad_alloc();
#else
      fprintf(stderr, "ERROR: Memory allocation failed in mcu8str_create\n");
      exit(EXIT_FAILURE);
#endif
      //gives (correctly but annoyingly) unreachable warning with MSVC
      //return mcu8str_create_empty();
    }
    s.c_str[0] = '\0';
    s.size = 0;
    s.buflen = (unsigned)(prealloc_size + 1);//cast ok, checked above
    s.owns_memory = 1;
    return s;
  }